

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  bool bVar2;
  Type *message_00;
  Type *enum_type;
  MessageOptions *options;
  Type *field;
  LocationRecorder location;
  
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = LookingAt(this,"message");
    if (bVar1) {
      LocationRecorder::LocationRecorder
                (&location,message_location,3,
                 (message->nested_type_).super_RepeatedPtrFieldBase.current_size_);
      message_00 = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                             (&(message->nested_type_).super_RepeatedPtrFieldBase);
      bVar2 = ParseMessageDefinition(this,message_00,&location);
    }
    else {
      bVar1 = LookingAt(this,"enum");
      if (bVar1) {
        LocationRecorder::LocationRecorder
                  (&location,message_location,4,
                   (message->enum_type_).super_RepeatedPtrFieldBase.current_size_);
        enum_type = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                              (&(message->enum_type_).super_RepeatedPtrFieldBase);
        bVar2 = ParseEnumDefinition(this,enum_type,&location);
      }
      else {
        bVar1 = LookingAt(this,"extensions");
        if (bVar1) {
          LocationRecorder::LocationRecorder(&location,message_location,5);
          bVar2 = ParseExtensions(this,message,&location);
        }
        else {
          bVar1 = LookingAt(this,"extend");
          if (bVar1) {
            LocationRecorder::LocationRecorder(&location,message_location,6);
            bVar2 = ParseExtend(this,&message->extension_,&message->nested_type_,message_location,3,
                                &location);
          }
          else {
            bVar1 = LookingAt(this,"option");
            if (bVar1) {
              LocationRecorder::LocationRecorder(&location,message_location,7);
              options = DescriptorProto::mutable_options(message);
              bVar2 = ParseOption(this,&options->super_Message,&location,OPTION_STATEMENT);
            }
            else {
              LocationRecorder::LocationRecorder
                        (&location,message_location,2,
                         (message->field_).super_RepeatedPtrFieldBase.current_size_);
              field = internal::RepeatedPtrFieldBase::
                      Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                                (&(message->field_).super_RepeatedPtrFieldBase);
              bVar2 = ParseMessageField(this,field,&message->nested_type_,message_location,3,
                                        &location);
            }
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(),
                       message_location,
                       DescriptorProto::kNestedTypeFieldNumber,
                       location);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, OPTION_STATEMENT);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(message->add_field(),
                             message->mutable_nested_type(),
                             message_location,
                             DescriptorProto::kNestedTypeFieldNumber,
                             location);
  }
}